

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void golf_lightmap_image_finalize(golf_lightmap_image_t *lightmap)

{
  sg_image *psVar1;
  sg_image sVar2;
  void *mem;
  undefined1 local_6c0 [8];
  sg_image_desc img_desc;
  int i;
  uchar *sg_image_data;
  int s;
  golf_lightmap_image_t *lightmap_local;
  
  for (sg_image_data._4_4_ = 0; sg_image_data._4_4_ < lightmap->num_samples;
      sg_image_data._4_4_ = sg_image_data._4_4_ + 1) {
    mem = golf_alloc_tracked((long)(lightmap->width * 4 * lightmap->height),
                             "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/level.c"
                            );
    for (img_desc._1684_4_ = 0; (int)img_desc._1684_4_ < lightmap->width * 4 * lightmap->height;
        img_desc._1684_4_ = img_desc._1684_4_ + 4) {
      *(uchar *)((long)mem + (long)(int)img_desc._1684_4_) =
           lightmap->data[sg_image_data._4_4_][(int)img_desc._1684_4_ / 4];
      *(uchar *)((long)mem + (long)(img_desc._1684_4_ + 1)) =
           lightmap->data[sg_image_data._4_4_][(int)img_desc._1684_4_ / 4];
      *(uchar *)((long)mem + (long)(img_desc._1684_4_ + 2)) =
           lightmap->data[sg_image_data._4_4_][(int)img_desc._1684_4_ / 4];
      *(undefined1 *)((long)mem + (long)(img_desc._1684_4_ + 3)) = 0xff;
    }
    memset(local_6c0,0,0x698);
    img_desc.type = lightmap->width;
    img_desc._8_4_ = lightmap->height;
    img_desc.num_mipmaps = 0x17;
    img_desc.pixel_format = SG_PIXELFORMAT_R8;
    img_desc.sample_count = 2;
    img_desc.min_filter = SG_FILTER_LINEAR;
    img_desc.mag_filter = SG_FILTER_LINEAR;
    img_desc.data.subimage[0][0].ptr = (void *)(long)(lightmap->width * 4 * lightmap->height);
    psVar1 = lightmap->sg_image;
    img_desc._72_8_ = mem;
    sVar2 = sg_make_image((sg_image_desc *)local_6c0);
    psVar1[sg_image_data._4_4_].id = sVar2.id;
    golf_free_tracked(mem);
  }
  return;
}

Assistant:

void golf_lightmap_image_finalize(golf_lightmap_image_t *lightmap) {
    for (int s = 0; s < lightmap->num_samples; s++) {
        unsigned char *sg_image_data = golf_alloc(4 * lightmap->width * lightmap->height);
        for (int i = 0; i < 4 * lightmap->width * lightmap->height; i += 4) {
            sg_image_data[i + 0] = lightmap->data[s][i / 4];
            sg_image_data[i + 1] = lightmap->data[s][i / 4];
            sg_image_data[i + 2] = lightmap->data[s][i / 4];
            sg_image_data[i + 3] = 0xFF;
        }
        sg_image_desc img_desc = {
            .width = lightmap->width,
            .height = lightmap->height,
            .pixel_format = SG_PIXELFORMAT_RGBA8,
            .min_filter = SG_FILTER_LINEAR,
            .mag_filter = SG_FILTER_LINEAR,
            .wrap_u = SG_WRAP_CLAMP_TO_EDGE,
            .wrap_v = SG_WRAP_CLAMP_TO_EDGE,
            .data.subimage[0][0] = {
                .ptr = sg_image_data,
                .size = 4 * lightmap->width * lightmap->height,
            },
        };
        lightmap->sg_image[s] = sg_make_image(&img_desc);
        golf_free(sg_image_data);
    }
}